

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O3

bool slang::matches(string_view str,string_view pattern)

{
  char cVar1;
  ulong uVar2;
  size_type __rlen;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  bool bVar8;
  bool bVar9;
  string_view str_00;
  string_view pattern_00;
  
  pcVar6 = pattern._M_str;
  sVar7 = pattern._M_len;
  pcVar4 = str._M_str;
  uVar3 = str._M_len;
  uVar2 = uVar3;
  if (sVar7 != 0) {
    uVar2 = uVar3 - sVar7;
    do {
      cVar1 = *pcVar6;
      if (cVar1 == '*') {
        if (sVar7 - 1 == 0) {
          return true;
        }
        if (uVar3 == 0) {
          return false;
        }
        uVar2 = 1;
        uVar5 = uVar3;
        do {
          str_00._M_str = pcVar4 + (uVar2 - 1);
          str_00._M_len = uVar5;
          pattern_00._M_str = pcVar6 + 1;
          pattern_00._M_len = sVar7 - 1;
          bVar8 = matches(str_00,pattern_00);
          if (bVar8) {
            return bVar8;
          }
          uVar5 = uVar5 - 1;
          bVar9 = uVar2 < uVar3;
          uVar2 = uVar2 + 1;
        } while (bVar9);
        return bVar8;
      }
      bVar8 = uVar3 == 0;
      uVar3 = uVar3 - 1;
      if (bVar8) {
        return false;
      }
      if ((cVar1 != '?') && (*pcVar4 != cVar1)) {
        return false;
      }
      pcVar4 = pcVar4 + 1;
      pcVar6 = pcVar6 + 1;
      sVar7 = sVar7 - 1;
    } while (sVar7 != 0);
  }
  return uVar2 == 0;
}

Assistant:

static bool matches(std::string_view str, std::string_view pattern) {
    while (true) {
        // Empty pattern matches empty string.
        if (pattern.empty())
            return str.empty();

        // If next pattern char is '*' try to match pattern[1..] against
        // all possible tail strings of str to see if at least one succeeds.
        if (pattern[0] == '*') {
            // Simple case: if pattern is just '*' it matches anything.
            pattern = pattern.substr(1);
            if (pattern.empty())
                return true;

            for (size_t i = 0, end = str.size(); i < end; i++) {
                if (matches(str.substr(i), pattern))
                    return true;
            }
            return false;
        }

        // If pattern char isn't '*' then it must consume one character.
        if (str.empty())
            return false;

        // '?' matches any character, otherwise we need exact match.
        if (str[0] != pattern[0] && pattern[0] != '?')
            return false;

        str = str.substr(1);
        pattern = pattern.substr(1);
    }
}